

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TupleOptimization.cpp
# Opt level: O3

void __thiscall wasm::TupleOptimization::optimize(TupleOptimization *this,Function *func)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Index IVar3;
  size_t sVar4;
  pointer puVar5;
  mapped_type *pmVar6;
  Expression **ppEVar7;
  Type *pTVar8;
  _Bit_type *p_Var9;
  pointer puVar10;
  ulong uVar11;
  Index IVar12;
  long lVar13;
  ulong uVar14;
  __node_base *p_Var15;
  _Bit_type *p_Var16;
  Type type;
  undefined1 auStack_278 [8];
  MapApplier mapApplier;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  tupleToNewBaseMap;
  UniqueDeferredQueue<unsigned_int> work;
  long local_80;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> local_78;
  TupleOptimization *local_70;
  vector<bool,_std::allocator<bool>_> local_68;
  Function *local_40;
  key_type local_34;
  
  local_40 = func;
  sVar4 = Function::getNumLocals(func);
  auStack_278 = (undefined1  [8])((ulong)auStack_278 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&work.count._M_h._M_single_bucket,sVar4,
             (bool *)auStack_278,(allocator_type *)&tupleToNewBaseMap._M_h._M_single_bucket);
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  tupleToNewBaseMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             &tupleToNewBaseMap._M_h._M_single_bucket,0);
  work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize;
  work.count._M_h._M_buckets = (__buckets_ptr)0x1;
  work.count._M_h._M_bucket_count = 0;
  work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  work.count._M_h._M_element_count._0_4_ = 0x3f800000;
  work.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  work.count._M_h._M_rehash_policy._4_4_ = 0;
  work.count._M_h._M_rehash_policy._M_next_resize = 0;
  puVar5 = (this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar10 != puVar5) {
    uVar11 = 0;
    do {
      uVar2 = (this->validUses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar11];
      if (puVar5[uVar11] < uVar2) {
        __assert_fail("validUses[i] <= uses[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                      ,0xa9,"void wasm::TupleOptimization::optimize(Function *)");
      }
      if (uVar2 < puVar5[uVar11]) {
        UniqueDeferredQueue<unsigned_int>::push
                  ((UniqueDeferredQueue<unsigned_int> *)&tupleToNewBaseMap._M_h._M_single_bucket,
                   (uint)uVar11);
        puVar5 = (this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar10 = (this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar11 = (ulong)((uint)uVar11 + 1);
    } while (uVar11 < (ulong)((long)puVar10 - (long)puVar5 >> 2));
  }
  while (((long)((long)work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_first -
                work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map_size) >> 2) +
         ((long)work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_node -
          (long)work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur >> 2) +
         ((((ulong)((long)work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last -
                   (long)work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
         (ulong)(work.data.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x80 != 0) {
    uVar2 = UniqueDeferredQueue<unsigned_int>::pop
                      ((UniqueDeferredQueue<unsigned_int> *)&tupleToNewBaseMap._M_h._M_single_bucket
                      );
    if (((ulong)work.count._M_h._M_single_bucket[uVar2 >> 6]._M_nxt >> ((ulong)uVar2 & 0x3f) & 1) ==
        0) {
      work.count._M_h._M_single_bucket[uVar2 >> 6]._M_nxt =
           (_Hash_node_base *)
           ((ulong)work.count._M_h._M_single_bucket[uVar2 >> 6]._M_nxt | 1L << ((byte)uVar2 & 0x3f))
      ;
      p_Var15 = &(this->copiedIndexes).
                 super__Vector_base<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_h._M_before_begin;
      while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
        UniqueDeferredQueue<unsigned_int>::push
                  ((UniqueDeferredQueue<unsigned_int> *)&tupleToNewBaseMap._M_h._M_single_bucket,
                   (uint)*(size_type *)(p_Var15 + 1));
      }
    }
  }
  auStack_278 = (undefined1  [8])((ulong)auStack_278 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_68,sVar4,(bool *)auStack_278,
             (allocator_type *)&mapApplier.replacedTees._M_h._M_single_bucket);
  puVar5 = (this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(this->uses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  if (lVar13 != 0) {
    uVar14 = lVar13 >> 2;
    uVar11 = 0;
    type.id = 0;
LAB_00b53145:
    do {
      if (puVar5[uVar11] != 0) {
        if (((ulong)work.count._M_h._M_single_bucket[uVar11 >> 6]._M_nxt >> (uVar11 & 0x3f) & 1) ==
            0) {
          local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] =
               local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
          uVar11 = (ulong)((int)uVar11 + 1);
          type.id = 1;
          if (uVar14 <= uVar11) goto LAB_00b53188;
          goto LAB_00b53145;
        }
      }
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (uVar11 < uVar14);
    if (type.id != 0) {
LAB_00b53188:
      mapApplier.replacedTees._M_h._M_single_bucket =
           (__node_base_ptr)&tupleToNewBaseMap._M_h._M_rehash_policy._M_next_resize;
      tupleToNewBaseMap._M_h._M_buckets = (__buckets_ptr)0x1;
      tupleToNewBaseMap._M_h._M_bucket_count = 0;
      tupleToNewBaseMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      tupleToNewBaseMap._M_h._M_element_count._0_4_ = 0x3f800000;
      tupleToNewBaseMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      tupleToNewBaseMap._M_h._M_rehash_policy._4_4_ = 0;
      tupleToNewBaseMap._M_h._M_rehash_policy._M_next_resize = 0;
      local_34 = 0;
      uVar11 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      local_70 = this;
      if (((long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p) * 8 + uVar11 != 0) {
        uVar14 = 0;
        p_Var9 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        p_Var16 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        do {
          IVar12 = (Index)uVar14;
          if ((p_Var16[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
            sVar4 = Function::getNumLocals(local_40);
            pmVar6 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&mapApplier.replacedTees._M_h._M_single_bucket,&local_34);
            *pmVar6 = (mapped_type)sVar4;
            local_78._M_head_impl = (DylinkSection *)Function::getLocalType(local_40,local_34);
            mapApplier.
            super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
            .
            super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
            .replacep = (Expression **)0x0;
            auStack_278 = (undefined1  [8])&local_78;
            ppEVar7 = (Expression **)wasm::Type::size((Type *)&local_78);
            if ((mapApplier.
                 super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                 .
                 super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                 .replacep != ppEVar7) || (auStack_278 != (undefined1  [8])&local_78)) {
              IVar12 = 0;
              do {
                pTVar8 = wasm::Type::Iterator::operator*((Iterator *)auStack_278);
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pTVar8->id;
                IVar3 = Builder::addVar((Builder *)local_40,(Function *)0x0,(Name)(auVar1 << 0x40),
                                        type);
                if (IVar12 == 0) {
                  if (sVar4 != IVar3) {
                    __assert_fail("newIndex == newBase",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                                  ,0xde,"void wasm::TupleOptimization::optimize(Function *)");
                  }
                }
                else if (IVar3 != IVar12 + 1) {
                  __assert_fail("newIndex == lastNewIndex + 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TupleOptimization.cpp"
                                ,0xe1,"void wasm::TupleOptimization::optimize(Function *)");
                }
                mapApplier.
                super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                .
                super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                .replacep = (Expression **)
                            ((long)mapApplier.
                                   super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                                   .
                                   super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                                   .replacep + 1);
                IVar12 = IVar3;
              } while ((mapApplier.
                        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                        .
                        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                        .replacep != ppEVar7) || (auStack_278 != (undefined1  [8])&local_78));
            }
            uVar11 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            p_Var9 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            p_Var16 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            IVar12 = local_34;
          }
          local_34 = IVar12 + 1;
          uVar14 = (ulong)local_34;
          type.id = uVar11;
        } while (uVar14 < uVar11 + ((long)p_Var9 - (long)p_Var16) * 8);
      }
      mapApplier.tupleToNewBaseMap =
           (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)&mapApplier.replacedTees._M_h._M_rehash_policy._M_next_resize;
      auStack_278 = (undefined1  [8])0x0;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .replacep = (Expression **)0x0;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .stack.fixed._M_elems[9].currp = (Expression **)0x0;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .currModule = (Module *)&mapApplier.replacedTees._M_h._M_single_bucket;
      mapApplier.replacedTees._M_h._M_buckets = (__buckets_ptr)0x1;
      mapApplier.replacedTees._M_h._M_bucket_count = 0;
      mapApplier.replacedTees._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      mapApplier.replacedTees._M_h._M_element_count._0_4_ = 0x3f800000;
      mapApplier.replacedTees._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      mapApplier.replacedTees._M_h._M_rehash_policy._4_4_ = 0;
      mapApplier.replacedTees._M_h._M_rehash_policy._M_next_resize = 0;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .currFunction =
           (Function *)
           (local_70->
           super_WalkerPass<wasm::PostWalker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>_>
           ).
           super_PostWalker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>.
           super_Walker<wasm::TupleOptimization,_wasm::Visitor<wasm::TupleOptimization,_void>_>.
           currModule;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_40;
      Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      ::walk((Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
              *)auStack_278,&local_40->body);
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mapApplier.
      super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .
      super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
      .currFunction = (Function *)0x0;
      std::
      _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::LocalSet_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::LocalSet_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::LocalSet_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::LocalSet_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&mapApplier.tupleToNewBaseMap);
      if (mapApplier.
          super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
          .
          super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
          .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
        operator_delete(mapApplier.
                        super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                        .
                        super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                        .stack.fixed._M_elems[9].currp,
                        (long)mapApplier.
                              super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                              .
                              super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)mapApplier.
                              super_PostWalker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                              .
                              super_Walker<wasm::TupleOptimization::MapApplier,_wasm::Visitor<wasm::TupleOptimization::MapApplier,_void>_>
                              .stack.fixed._M_elems[9].currp);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&mapApplier.replacedTees._M_h._M_single_bucket);
    }
  }
  if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((long)&work.data.c.
                           super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Deque_impl_data._M_finish + 0x18));
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             &tupleToNewBaseMap._M_h._M_single_bucket);
  if (work.count._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(work.count._M_h._M_single_bucket,
                    local_80 - (long)work.count._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void optimize(Function* func) {
    auto numLocals = func->getNumLocals();

    // Find the set of bad indexes. We add each such candidate to a worklist
    // that we will then flow to find all those corrupted.
    std::vector<bool> bad(numLocals);
    UniqueDeferredQueue<Index> work;

    for (Index i = 0; i < uses.size(); i++) {
      assert(validUses[i] <= uses[i]);
      if (uses[i] > 0 && validUses[i] < uses[i]) {
        // This is a bad tuple.
        work.push(i);
      }
    }

    // Flow badness forward.
    while (!work.empty()) {
      auto i = work.pop();
      if (bad[i]) {
        continue;
      }
      bad[i] = true;
      for (auto target : copiedIndexes[i]) {
        work.push(target);
      }
    }

    // Good indexes we can optimize are tuple locals with uses that are not bad.
    std::vector<bool> good(numLocals);
    bool hasGood = false;
    for (Index i = 0; i < uses.size(); i++) {
      if (uses[i] > 0 && !bad[i]) {
        good[i] = true;
        hasGood = true;
      }
    }

    if (!hasGood) {
      return;
    }

    // We found things to optimize! Create new non-tuple locals for their
    // contents, and then rewrite the code to use those according to the
    // mapping from tuple locals to normal ones. The mapping maps a tuple local
    // to the base index used for its contents: an index and several others
    // right after it, depending on the tuple size.
    std::unordered_map<Index, Index> tupleToNewBaseMap;
    for (Index i = 0; i < good.size(); i++) {
      if (!good[i]) {
        continue;
      }

      auto newBase = func->getNumLocals();
      tupleToNewBaseMap[i] = newBase;
      Index lastNewIndex = 0;
      for (auto t : func->getLocalType(i)) {
        Index newIndex = Builder::addVar(func, t);
        if (lastNewIndex == 0) {
          // This is the first new local we added (0 is an impossible value,
          // since tuple locals exist, hence index 0 was already taken), so it
          // must be equal to the base.
          assert(newIndex == newBase);
        } else {
          // This must be right after the former.
          assert(newIndex == lastNewIndex + 1);
        }
        lastNewIndex = newIndex;
      }
    }

    MapApplier mapApplier(tupleToNewBaseMap);
    mapApplier.walkFunctionInModule(func, getModule());
  }